

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O0

int mg_session_flush_chunk(mg_session *session)

{
  __uint16_t _Var1;
  int iVar2;
  char *buf;
  mg_session *in_RDI;
  size_t chunk_size;
  int local_4;
  
  buf = (char *)(in_RDI->out_end - in_RDI->out_begin);
  if (buf == (char *)0x0) {
    local_4 = 0;
  }
  else {
    if ((char *)0xffff < buf) {
      abort();
    }
    _Var1 = __bswap_16((__uint16_t)buf);
    *(__uint16_t *)in_RDI->out_buffer = _Var1;
    iVar2 = mg_transport_send((mg_transport *)in_RDI,buf,0x10777d);
    if (iVar2 == 0) {
      in_RDI->out_end = in_RDI->out_begin;
      local_4 = 0;
    }
    else {
      mg_session_set_error(in_RDI,"failed to send chunk data");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int mg_session_flush_chunk(mg_session *session) {
  size_t chunk_size = session->out_end - session->out_begin;
  if (!chunk_size) {
    return 0;
  }
  if (chunk_size > MG_BOLT_MAX_CHUNK_SIZE) {
    abort();
  }

  // Actual chunk data is written with offset of two bytes, leaving 2 bytes for
  // chunk size which we write here before sending.
  assert(session->out_begin == MG_BOLT_CHUNK_HEADER_SIZE);
  assert(MG_BOLT_CHUNK_HEADER_SIZE == sizeof(uint16_t));

  *(uint16_t *)session->out_buffer = htobe16((uint16_t)chunk_size);

  if (mg_transport_send(session->transport, session->out_buffer,
                        session->out_end) != 0) {
    mg_session_set_error(session, "failed to send chunk data");
    return MG_ERROR_SEND_FAILED;
  }

  session->out_end = session->out_begin;
  return 0;
}